

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

Entity * __thiscall
Entity::checkCollisions(Entity *this,list<Entity_*,_std::allocator<Entity_*>_> *e)

{
  Entity *this_00;
  bool bVar1;
  reference ppEVar2;
  Entity *in_RDI;
  float x1;
  float y1;
  float r1;
  float er;
  float ey;
  float ex;
  Entity *entity;
  iterator it;
  _Self in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<Entity_*> local_20 [4];
  
  std::_List_iterator<Entity_*>::_List_iterator(local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::begin
                       ((list<Entity_*,_std::allocator<Entity_*>_> *)in_RDI);
  local_20[0]._M_node = local_28;
  do {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::end
                   ((list<Entity_*,_std::allocator<Entity_*>_> *)in_RDI);
    bVar1 = std::operator!=(local_20,&local_30);
    if (!bVar1) {
      return (Entity *)0x0;
    }
    ppEVar2 = std::_List_iterator<Entity_*>::operator*((_List_iterator<Entity_*> *)0x10f6ab);
    this_00 = *ppEVar2;
    if ((this_00 != in_RDI) && (bVar1 = getDestructable(this_00), bVar1)) {
      x1 = getX(this_00);
      y1 = getY(this_00);
      r1 = getRadius(this_00);
      bVar1 = checkCircleCollision
                        (x1,y1,r1,in_stack_ffffffffffffffb8,
                         (float)((ulong)in_stack_ffffffffffffffb0._M_node >> 0x20),
                         SUB84(in_stack_ffffffffffffffb0._M_node,0));
      if (bVar1) {
        return this_00;
      }
    }
    in_stack_ffffffffffffffb0 = std::_List_iterator<Entity_*>::operator++(local_20,0);
  } while( true );
}

Assistant:

Entity *Entity::checkCollisions(std::list<Entity *>& e)
{
   std::list<Entity *>::iterator it;

   for (it = e.begin(); it != e.end(); it++) {
      Entity *entity = *it;
      if (entity == this || !entity->getDestructable())
         continue;
      float ex = entity->getX();
      float ey = entity->getY();
      float er = entity->getRadius();
      if (checkCircleCollision(ex, ey, er, x, y, radius))
         return entity;
   }

   return 0;
}